

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes SzArEx_Open(CSzArEx *p,ILookInStream *inStream,ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  size_t size;
  SRes SVar1;
  UInt32 UVar2;
  int iVar3;
  long lVar4;
  ulong offset;
  UInt64 type;
  CBuf buf;
  Int64 startArcPos;
  CBuf tempBuf;
  CSzData sd;
  Byte header [32];
  Int64 pos;
  UInt64 local_f8;
  CBuf local_f0;
  UInt32 local_dc;
  Int64 local_d8;
  size_t local_d0;
  CBuf local_c8;
  CSzData local_b8;
  Byte local_a8 [6];
  char local_a2;
  UInt32 local_a0;
  ulong local_9c;
  size_t local_94;
  UInt32 local_8c;
  CSzAr local_88;
  
  local_d8 = 0;
  SVar1 = (*inStream->Seek)(inStream,&local_d8,SZ_SEEK_CUR);
  if ((SVar1 == 0) && (SVar1 = LookInStream_Read2(inStream,local_a8,0x20,0x11), SVar1 == 0)) {
    lVar4 = 0;
    SVar1 = 0x11;
    do {
      if (local_a8[lVar4] != k7zSignature[lVar4]) goto LAB_005cb31f;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    SVar1 = 4;
    if (local_a2 == '\0') {
      local_d0 = local_94;
      local_dc = local_8c;
      p->startPosAfterHeader = local_d8 + 0x20;
      UVar2 = CrcCalc(&local_9c,0x14);
      size = local_d0;
      SVar1 = 3;
      if (UVar2 == local_a0) {
        if (local_d0 == 0) {
          return 0;
        }
        SVar1 = 0x11;
        if (local_9c <= -local_d0 - 0x21 && !CARRY8(local_9c,local_d0)) {
          local_88.NumPackStreams = 0;
          local_88.NumFolders = 0;
          SVar1 = (*inStream->Seek)(inStream,(Int64 *)&local_88,SZ_SEEK_END);
          if (SVar1 == 0) {
            SVar1 = 6;
            if (((local_9c + local_d8 <= (ulong)local_88._0_8_) &&
                (offset = local_9c + local_d8 + 0x20,
                local_9c + local_d8 + size + 0x20 <= (ulong)local_88._0_8_ &&
                offset <= (ulong)local_88._0_8_)) &&
               (SVar1 = LookInStream_SeekTo(inStream,offset), SVar1 == 0)) {
              iVar3 = Buf_Create(&local_f0,size,allocTemp);
              if (iVar3 == 0) {
                SVar1 = 2;
              }
              else {
                SVar1 = LookInStream_Read(inStream,local_f0.data,size);
                if (SVar1 == 0) {
                  UVar2 = CrcCalc(local_f0.data,size);
                  SVar1 = 0x10;
                  if (UVar2 == local_dc) {
                    local_b8.Data = local_f0.data;
                    local_b8.Size = local_f0.size;
                    SVar1 = ReadNumber(&local_b8,&local_f8);
                    if ((SVar1 == 0) && (local_f8 == 0x17)) {
                      Buf_Init(&local_c8);
                      local_88.CoderUnpackSizes = (UInt64 *)0x0;
                      local_88.CodersData = (Byte *)0x0;
                      local_88.FoToCoderUnpackSizes = (UInt32 *)0x0;
                      local_88.FoToMainUnpackSizeIndex = (Byte *)0x0;
                      local_88.FoCodersOffsets = (size_t *)0x0;
                      local_88.FoStartPackStreamIndex = (UInt32 *)0x0;
                      local_88.FolderCRCs.Defs = (Byte *)0x0;
                      local_88.FolderCRCs.Vals = (UInt32 *)0x0;
                      local_88.NumPackStreams = 0;
                      local_88.NumFolders = 0;
                      local_88.PackPositions = (UInt64 *)0x0;
                      SVar1 = SzReadAndDecodePackedStreams
                                        (inStream,&local_b8,&local_c8,1,p->startPosAfterHeader,
                                         &local_88,allocTemp);
                      SzAr_Free(&local_88,allocTemp);
                      if (SVar1 == 0) {
                        Buf_Free(&local_f0,allocTemp);
                        local_f0.data = local_c8.data;
                        local_f0.size = local_c8.size;
                        local_b8.Data = local_c8.data;
                        local_b8.Size = local_c8.size;
                        SVar1 = ReadNumber(&local_b8,&local_f8);
                      }
                      else {
                        Buf_Free(&local_c8,allocTemp);
                      }
                    }
                    if ((SVar1 == 0) && (SVar1 = 4, local_f8 == 1)) {
                      SVar1 = SzReadHeader(p,&local_b8,inStream,allocMain,allocTemp);
                      Buf_Free(&local_f0,allocTemp);
                      if (SVar1 == 0) {
                        return 0;
                      }
                      goto LAB_005cb31f;
                    }
                  }
                }
                Buf_Free(&local_f0,allocTemp);
              }
            }
          }
        }
      }
    }
  }
LAB_005cb31f:
  SzArEx_Free(p,allocMain);
  return SVar1;
}

Assistant:

SRes SzArEx_Open(CSzArEx *p, ILookInStream *inStream,
    ISzAlloc *allocMain, ISzAlloc *allocTemp)
{
  SRes res = SzArEx_Open2(p, inStream, allocMain, allocTemp);
  if (res != SZ_OK)
    SzArEx_Free(p, allocMain);
  return res;
}